

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

data_node_type * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::split_upwards
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          int key,int stop_propagation_level,
          vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
          *traversal_path,bool reuse_model,model_node_type **new_parent,bool verbose)

{
  int *piVar1;
  longlong *plVar2;
  uint8_t *puVar3;
  undefined1 *puVar4;
  _func_int ***ppp_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint8_t uVar8;
  short sVar9;
  _func_int **pp_Var10;
  double dVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar15;
  pointer ppAVar16;
  byte bVar17;
  byte bVar18;
  data_node_type *pdVar19;
  data_node_type *pdVar20;
  ostream *poVar21;
  data_node_type *pdVar22;
  self_type *psVar23;
  pointer pTVar24;
  long *plVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  pointer pTVar30;
  pointer ppAVar31;
  byte bVar32;
  int iVar33;
  long lVar34;
  uint uVar35;
  int iVar36;
  data_node_type *pdVar37;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar38;
  byte bVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined8 uVar55;
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM4_Qa;
  double dVar56;
  undefined8 in_XMM5_Qb;
  data_node_type *local_f0;
  data_node_type *local_e0;
  short *local_d8;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_c8;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_c0;
  ulong local_b8;
  model_node_type *local_b0;
  ulong local_a8;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  *local_a0;
  vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_> to_delete;
  ulong local_50;
  
  if (stop_propagation_level < this->root_node_->level_) {
    __assert_fail("stop_propagation_level >= root_node_->level_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                  ,0x728,
                  "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                 );
  }
  to_delete.
  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar30 = (traversal_path->
            super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = pTVar30[-1].node;
  iVar36 = pTVar30[-1].bucketID;
  pAVar38 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
            )local_b0->children_[iVar36];
  uVar35 = 1 << ((pAVar38->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  local_b8 = (ulong)uVar35;
  piVar1 = &(this->stats_).num_sideways_splits;
  *piVar1 = *piVar1 + 1;
  iVar36 = iVar36 - iVar36 % (int)uVar35;
  dVar40 = (double)iVar36;
  iVar26 = iVar36 + uVar35;
  plVar2 = &(this->stats_).num_sideways_split_keys;
  *plVar2 = *plVar2 + (long)pAVar38->num_keys_;
  dVar11 = (double)(int)uVar35 * 0.5 + dVar40;
  dVar47 = (double)pAVar38->num_right_out_of_bounds_inserts_ / (double)pAVar38->num_inserts_;
  if (dVar47 <= 0.9) {
    bVar18 = 0;
LAB_0010c48c:
    bVar17 = 0;
  }
  else {
    auVar49._0_8_ = (double)pAVar38->max_key_;
    auVar49._8_8_ = in_ZMM3._8_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = (local_b0->super_AlexNode<int,_int>).model_.a_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (local_b0->super_AlexNode<int,_int>).model_.b_;
    auVar6 = vfmadd213sd_fma(auVar49,auVar52,auVar6);
    if ((auVar6._0_8_ < dVar40) || (in_ZMM3 = ZEXT864((ulong)dVar11), dVar11 <= auVar6._0_8_)) {
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar11;
      uVar55 = vcmppd_avx512vl(auVar6,auVar13,0xd);
      auVar53._0_8_ = (double)iVar26;
      auVar53._8_8_ = in_XMM4_Qa;
      in_ZMM3 = ZEXT1664(auVar53);
      uVar12 = vcmppd_avx512vl(auVar6,auVar53,1);
      bVar18 = (byte)uVar55 & 3 & (byte)uVar12;
      goto LAB_0010c48c;
    }
    bVar18 = 0;
    bVar17 = 1;
  }
  local_a8 = CONCAT44(local_a8._4_4_,iVar26);
  dVar56 = (double)pAVar38->num_left_out_of_bounds_inserts_ / (double)pAVar38->num_inserts_;
  if (dVar56 <= 0.9) {
    dVar44 = (local_b0->super_AlexNode<int,_int>).model_.a_;
    dVar48 = (local_b0->super_AlexNode<int,_int>).model_.b_;
    bVar39 = 0;
LAB_0010c52d:
    bVar32 = 0;
  }
  else {
    auVar54._0_8_ = (double)pAVar38->min_key_;
    auVar54._8_8_ = in_XMM5_Qb;
    dVar44 = (local_b0->super_AlexNode<int,_int>).model_.a_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar44;
    dVar48 = (local_b0->super_AlexNode<int,_int>).model_.b_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar48;
    auVar6 = vfmadd213sd_fma(auVar54,auVar45,auVar50);
    in_ZMM3 = ZEXT1664(auVar6);
    if ((auVar6._0_8_ < dVar40) || (dVar11 <= auVar6._0_8_)) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar11;
      uVar55 = vcmppd_avx512vl(auVar6,auVar14,0xd);
      auVar41._0_8_ = (double)iVar26;
      auVar41._8_8_ = in_XMM5_Qb;
      uVar12 = vcmppd_avx512vl(auVar6,auVar41,1);
      bVar39 = (byte)uVar55 & 3 & (byte)uVar12;
      goto LAB_0010c52d;
    }
    bVar39 = 0;
    bVar32 = 1;
  }
  local_c8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *)((dVar11 - dVar48) / dVar44);
  local_c0 = this;
  local_a0 = traversal_path;
  iVar26 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
           lower_bound<double>(pAVar38,(double *)&local_c8);
  pAVar15 = local_c0;
  pdVar19 = bulk_load_leaf_node_from_existing
                      (local_c0,pAVar38,0,iVar26,true,(FTNode *)0x0,reuse_model,
                       (bool)(0.9 < dVar47 & bVar17),(bool)(0.9 < dVar56 & bVar32));
  pdVar20 = bulk_load_leaf_node_from_existing
                      (pAVar15,pAVar38,iVar26,pAVar38->data_capacity_,true,(FTNode *)0x0,reuse_model
                       ,(bool)(0.9 < dVar47 & bVar18),(bool)(0.9 < dVar56 & bVar39));
  uVar8 = (pAVar38->super_AlexNode<int,_int>).duplication_factor_;
  (pdVar19->super_AlexNode<int,_int>).duplication_factor_ = uVar8;
  (pdVar20->super_AlexNode<int,_int>).duplication_factor_ = uVar8;
  sVar9 = (pAVar38->super_AlexNode<int,_int>).level_;
  (pdVar19->super_AlexNode<int,_int>).level_ = sVar9;
  (pdVar20->super_AlexNode<int,_int>).level_ = sVar9;
  psVar23 = pAVar38->prev_leaf_;
  if (psVar23 != (self_type *)0x0) {
    psVar23->next_leaf_ = pdVar19;
  }
  pdVar19->prev_leaf_ = psVar23;
  pdVar19->next_leaf_ = pdVar20;
  pdVar20->prev_leaf_ = pdVar19;
  psVar23 = pAVar38->next_leaf_;
  pdVar20->next_leaf_ = psVar23;
  if (psVar23 != (self_type *)0x0) {
    psVar23->prev_leaf_ = pdVar20;
  }
  local_c8 = pAVar38;
  if (to_delete.
      super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      to_delete.
      super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
    _M_realloc_insert<alex::AlexNode<int,int>*>
              ((vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)
               &to_delete,
               (iterator)
               to_delete.
               super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(AlexNode<int,_int> **)&local_c8);
  }
  else {
    *to_delete.
     super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = (AlexNode<int,_int> *)pAVar38;
    to_delete.
    super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         to_delete.
         super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  piVar1 = &(local_c0->stats_).num_data_nodes;
  *piVar1 = *piVar1 + -1;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Splitting upwards data node] level ",0x24);
    poVar21 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cout,(pAVar38->super_AlexNode<int,_int>).level_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", node addr: ",0xd);
    poVar21 = std::ostream::_M_insert<void_const*>(poVar21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", node repeats in parent: ",0x1a);
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,(int)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", node indexes in parent: [",0x1b);
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,(int)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", left leaf indexes: [0, ",0x19);
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", right leaf indexes: [",0x17);
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,pAVar38->data_capacity_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", new nodes addr: ",0x12);
    poVar21 = std::ostream::_M_insert<void_const*>(poVar21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,",",1);
    poVar21 = std::ostream::_M_insert<void_const*>(poVar21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
    std::ostream::put((char)poVar21);
    std::ostream::flush();
  }
  dVar40 = (local_b0->super_AlexNode<int,_int>).model_.a_;
  dVar47 = (local_b0->super_AlexNode<int,_int>).model_.b_;
  pTVar24 = (local_a0->
            super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar27 = (long)(local_a0->
                 super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar24;
  local_a8 = uVar27 >> 4;
  local_50 = (long)(uVar27 * 0x10000000 + -0x100000000) >> 0x20;
  pAVar38 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
            )pTVar24[local_50].node;
  pTVar30 = pTVar24 + local_50;
  iVar36 = (int)(pAVar38->super_AlexNode<int,_int>).level_;
  local_f0 = pdVar19;
  local_e0 = pdVar20;
  if (stop_propagation_level < iVar36) {
    puVar4 = &local_c0->field_0xbd;
    pdVar37 = pdVar19;
    do {
      local_d8 = &(pAVar38->super_AlexNode<int,_int>).level_;
      piVar1 = &(local_c0->stats_).num_model_node_splits;
      *piVar1 = *piVar1 + 1;
      iVar36 = *(int *)&pAVar38->allocator_;
      plVar2 = &(local_c0->stats_).num_model_node_split_pointers;
      *plVar2 = *plVar2 + (long)iVar36;
      iVar26 = pTVar30->bucketID;
      iVar36 = iVar36 / 2;
      if (iVar26 < iVar36) {
        if (1 << (*(byte *)((long)(&(pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)
                                  [iVar36] + 9) & 0x1f) == iVar36) {
          local_f0 = (data_node_type *)operator_new(0x40);
          pdVar22 = (data_node_type *)0x0;
          sVar9 = *local_d8;
          (local_f0->super_AlexNode<int,_int>).is_leaf_ = false;
          (local_f0->super_AlexNode<int,_int>).duplication_factor_ = '\0';
          (local_f0->super_AlexNode<int,_int>).level_ = sVar9;
          local_b8 = CONCAT71((uint7)(byte)((ushort)sVar9 >> 8),1);
          (local_f0->super_AlexNode<int,_int>).model_.a_ = 0.0;
          (local_f0->super_AlexNode<int,_int>).model_.b_ = 0.0;
          (local_f0->super_AlexNode<int,_int>).cost_ = 0.0;
          (local_f0->super_AlexNode<int,_int>)._vptr_AlexNode =
               (_func_int **)&PTR__AlexModelNode_00116cd8;
          local_f0->key_less_ = (AlexCompare *)puVar4;
          *(undefined4 *)&local_f0->allocator_ = 0;
          local_f0->next_leaf_ = (self_type *)0x0;
        }
        else {
LAB_0010ca31:
          local_f0 = (data_node_type *)operator_new(0x40);
          sVar9 = *local_d8;
          (local_f0->super_AlexNode<int,_int>).is_leaf_ = false;
          (local_f0->super_AlexNode<int,_int>).duplication_factor_ = '\0';
          (local_f0->super_AlexNode<int,_int>).level_ = sVar9;
          (local_f0->super_AlexNode<int,_int>).model_.a_ = 0.0;
          (local_f0->super_AlexNode<int,_int>).model_.b_ = 0.0;
          (local_f0->super_AlexNode<int,_int>).cost_ = 0.0;
          (local_f0->super_AlexNode<int,_int>)._vptr_AlexNode =
               (_func_int **)&PTR__AlexModelNode_00116cd8;
          local_f0->key_less_ = (AlexCompare *)puVar4;
          *(undefined4 *)&local_f0->allocator_ = 0;
          local_f0->next_leaf_ = (self_type *)0x0;
          pdVar22 = (data_node_type *)operator_new(0x40);
          sVar9 = *local_d8;
          (pdVar22->super_AlexNode<int,_int>).is_leaf_ = false;
          (pdVar22->super_AlexNode<int,_int>).duplication_factor_ = '\0';
          local_b8 = 0;
          local_b0 = (model_node_type *)0x0;
          (pdVar22->super_AlexNode<int,_int>).level_ = sVar9;
          (pdVar22->super_AlexNode<int,_int>).model_.a_ = 0.0;
          (pdVar22->super_AlexNode<int,_int>).model_.b_ = 0.0;
          (pdVar22->super_AlexNode<int,_int>).cost_ = 0.0;
          (pdVar22->super_AlexNode<int,_int>)._vptr_AlexNode =
               (_func_int **)&PTR__AlexModelNode_00116cd8;
          pdVar22->key_less_ = (AlexCompare *)puVar4;
          *(undefined4 *)&pdVar22->allocator_ = 0;
          pdVar22->next_leaf_ = (self_type *)0x0;
          if (iVar36 <= iVar26) goto LAB_0010cbdf;
        }
        if ((int)local_a8 ==
            (int)((ulong)((long)(local_a0->
                                super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_a0->
                               super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          *new_parent = (model_node_type *)local_f0;
        }
        iVar36 = *(int *)&pAVar38->allocator_;
        *(int *)&local_f0->allocator_ = iVar36;
        psVar23 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                            ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_c8,(long)iVar36,
                             (void *)0x0);
        local_f0->next_leaf_ = psVar23;
        iVar26 = 0;
        dVar56 = (pAVar38->super_AlexNode<int,_int>).model_.a_;
        dVar44 = (pAVar38->super_AlexNode<int,_int>).model_.b_;
        (local_f0->super_AlexNode<int,_int>).model_.a_ = dVar56 + dVar56;
        (local_f0->super_AlexNode<int,_int>).model_.b_ = dVar44 + dVar44;
        iVar36 = *(int *)&pAVar38->allocator_ / 2;
        if (1 < *(int *)&pAVar38->allocator_) {
          iVar26 = 0;
          do {
            pp_Var10 = (&(pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar26];
            bVar18 = *(byte *)((long)pp_Var10 + 9);
            if (bVar18 != 0x1f) {
              lVar34 = (long)(iVar26 * 2);
              do {
                (&(local_f0->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar34] =
                     pp_Var10;
                lVar34 = lVar34 + 1;
              } while ((2 << (bVar18 & 0x1f)) + iVar26 * 2 != lVar34);
            }
            iVar26 = iVar26 + (1 << (bVar18 & 0x1f));
            *(byte *)((long)pp_Var10 + 9) = bVar18 + 1;
          } while (iVar26 < iVar36);
        }
        if (iVar26 != iVar36) {
          __assert_fail("cur == cur_node->num_children_ / 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                        ,0x7c6,
                        "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        if ((char)local_b8 == '\0') {
          *(int *)&pdVar22->allocator_ = iVar36;
          psVar23 = (self_type *)
                    __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                              ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_c8,(long)iVar36,
                               (void *)0x0);
          pdVar22->next_leaf_ = psVar23;
          (pdVar22->super_AlexNode<int,_int>).model_.a_ =
               (pAVar38->super_AlexNode<int,_int>).model_.a_;
          iVar36 = *(int *)&pAVar38->allocator_;
          (pdVar22->super_AlexNode<int,_int>).model_.b_ =
               (pAVar38->super_AlexNode<int,_int>).model_.b_ - (double)(iVar36 / 2);
          if (0 < (long)iVar36) {
            uVar27 = (ulong)(uint)(iVar36 / 2);
            lVar34 = 0;
            do {
              ppp_Var5 = &(pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode + uVar27;
              uVar27 = uVar27 + 1;
              *(_func_int ***)
               ((long)&(pdVar22->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode + lVar34) =
                   *ppp_Var5;
              lVar34 = lVar34 + 8;
            } while (uVar27 < (ulong)(long)iVar36);
          }
        }
        else {
          pdVar22 = (data_node_type *)
                    (&(pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar36];
          (pdVar22->super_AlexNode<int,_int>).level_ = *local_d8;
        }
        iVar26 = pTVar30->bucketID * 2;
        iVar33 = 2 << ((pdVar37->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
        iVar26 = iVar26 - iVar26 % iVar33;
        iVar36 = (iVar33 >> 1) + iVar26;
        if (0 < iVar33 >> 1) {
          lVar34 = (long)iVar26;
          do {
            (&(local_f0->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar34] =
                 (_func_int **)pdVar37;
            lVar34 = lVar34 + 1;
          } while (lVar34 < iVar36);
        }
        if (0 < iVar33) {
          lVar34 = (long)iVar36;
          do {
            (&(local_f0->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar34] =
                 (_func_int **)local_e0;
            lVar34 = lVar34 + 1;
          } while (lVar34 < iVar26 + iVar33);
        }
        local_b0 = (model_node_type *)0x0;
      }
      else {
        if (1 << (*(byte *)((long)(pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode + 9
                           ) & 0x1f) != iVar36) goto LAB_0010ca31;
        pdVar22 = (data_node_type *)operator_new(0x40);
        local_f0 = (data_node_type *)0x0;
        sVar9 = *local_d8;
        (pdVar22->super_AlexNode<int,_int>).is_leaf_ = false;
        (pdVar22->super_AlexNode<int,_int>).duplication_factor_ = '\0';
        (pdVar22->super_AlexNode<int,_int>).level_ = sVar9;
        local_b0 = (model_node_type *)CONCAT71((uint7)(byte)((ushort)sVar9 >> 8),1);
        (pdVar22->super_AlexNode<int,_int>).model_.a_ = 0.0;
        (pdVar22->super_AlexNode<int,_int>).model_.b_ = 0.0;
        (pdVar22->super_AlexNode<int,_int>).cost_ = 0.0;
        (pdVar22->super_AlexNode<int,_int>)._vptr_AlexNode =
             (_func_int **)&PTR__AlexModelNode_00116cd8;
        pdVar22->key_less_ = (AlexCompare *)puVar4;
        *(undefined4 *)&pdVar22->allocator_ = 0;
        pdVar22->next_leaf_ = (self_type *)0x0;
LAB_0010cbdf:
        if ((int)local_a8 ==
            (int)((ulong)((long)(local_a0->
                                super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_a0->
                               super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          *new_parent = (model_node_type *)pdVar22;
        }
        if ((char)local_b0 == '\0') {
          iVar36 = *(int *)&pAVar38->allocator_ / 2;
          *(int *)&local_f0->allocator_ = iVar36;
          psVar23 = (self_type *)
                    __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                              ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_c8,(long)iVar36,
                               (void *)0x0);
          local_f0->next_leaf_ = psVar23;
          dVar56 = (pAVar38->super_AlexNode<int,_int>).model_.b_;
          (local_f0->super_AlexNode<int,_int>).model_.a_ =
               (pAVar38->super_AlexNode<int,_int>).model_.a_;
          (local_f0->super_AlexNode<int,_int>).model_.b_ = dVar56;
          uVar35 = *(uint *)&pAVar38->allocator_;
          if (1 < (int)uVar35) {
            uVar27 = 0;
            do {
              (&(local_f0->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[uVar27] =
                   (&(pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar35 >> 1 != uVar27);
          }
        }
        else {
          local_f0 = (data_node_type *)
                     (pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode;
          (local_f0->super_AlexNode<int,_int>).level_ = *local_d8;
          uVar35 = *(uint *)&pAVar38->allocator_;
        }
        *(uint *)&pdVar22->allocator_ = uVar35;
        psVar23 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                            ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_c8,
                             (long)(int)uVar35,(void *)0x0);
        pdVar22->next_leaf_ = psVar23;
        uVar35 = *(uint *)&pAVar38->allocator_;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = (pAVar38->super_AlexNode<int,_int>).model_.a_;
        uVar29 = (int)uVar35 / 2;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = (pAVar38->super_AlexNode<int,_int>).model_.b_ - (double)(int)uVar29;
        auVar6 = vunpcklpd_avx(auVar51,auVar42);
        (pdVar22->super_AlexNode<int,_int>).model_.a_ = auVar6._0_8_ + auVar6._0_8_;
        (pdVar22->super_AlexNode<int,_int>).model_.b_ = auVar6._8_8_ + auVar6._8_8_;
        if (0 < (int)uVar35) {
          do {
            pp_Var10 = (&(pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)
                       [(int)uVar29];
            bVar18 = *(byte *)((long)pp_Var10 + 9);
            if (bVar18 != 0x1f) {
              lVar34 = (long)(int)((uVar29 - (uVar35 >> 1)) * 2);
              do {
                (&(pdVar22->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar34] = pp_Var10
                ;
                lVar34 = lVar34 + 1;
              } while ((int)((2 << (bVar18 & 0x1f)) + (uVar29 * 2 - (uVar35 & 0x7ffffffe))) !=
                       lVar34);
            }
            uVar29 = uVar29 + (1 << (bVar18 & 0x1f));
            *(byte *)((long)pp_Var10 + 9) = bVar18 + 1;
          } while ((int)uVar29 < (int)uVar35);
        }
        if (uVar29 != uVar35) {
          __assert_fail("cur == cur_node->num_children_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                        ,0x816,
                        "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        iVar26 = (pTVar30->bucketID - (uVar35 - ((int)uVar35 >> 0x1f) >> 1)) * 2;
        iVar33 = 2 << ((pdVar37->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
        iVar26 = iVar26 - iVar26 % iVar33;
        iVar36 = (iVar33 >> 1) + iVar26;
        if (0 < iVar33 >> 1) {
          lVar34 = (long)iVar26;
          do {
            (&(pdVar22->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar34] =
                 (_func_int **)pdVar37;
            lVar34 = lVar34 + 1;
          } while (lVar34 < iVar36);
        }
        if (0 < iVar33) {
          lVar34 = (long)iVar36;
          do {
            (&(pdVar22->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar34] =
                 (_func_int **)local_e0;
            lVar34 = lVar34 + 1;
          } while (lVar34 < iVar26 + iVar33);
        }
        local_b8 = 0;
      }
      if ((pdVar22 == (data_node_type *)0x0) || (local_f0 == (data_node_type *)0x0)) {
        __assert_fail("next_left_split != nullptr && next_right_split != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                      ,0x829,
                      "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[Splitting upwards through-node] level ",0x27);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,", node addr: ",0xd);
        poVar21 = std::ostream::_M_insert<void_const*>(poVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,", node children: ",0x11);
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,pTVar30->node->num_children_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,", child index: ",0xf);
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,pTVar30->bucketID);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,", child repeats in node: ",0x19)
        ;
        poVar21 = (ostream *)
                  std::ostream::operator<<
                            (poVar21,1 << ((pdVar37->super_AlexNode<int,_int>).duplication_factor_ &
                                          0x1f));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar21,", node repeats in parent: ",0x1a);
        poVar21 = (ostream *)
                  std::ostream::operator<<
                            (poVar21,1 << ((pTVar30->node->super_AlexNode<int,_int>).
                                           duplication_factor_ & 0x1f));
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,", new nodes addr: ",0x12);
        poVar21 = std::ostream::_M_insert<void_const*>(poVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,",",1);
        poVar21 = std::ostream::_M_insert<void_const*>(poVar21);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
      }
      local_c8 = pAVar38;
      if (to_delete.
          super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          to_delete.
          super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
        _M_realloc_insert<alex::AlexNode<int,int>*>
                  ((vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)
                   &to_delete,
                   (iterator)
                   to_delete.
                   super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(AlexNode<int,_int> **)&local_c8);
      }
      else {
        *to_delete.
         super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &pAVar38->super_AlexNode<int,_int>;
        to_delete.
        super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             to_delete.
             super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if ((char)local_b0 == '\0' && (char)local_b8 == '\0') {
        piVar1 = &(local_c0->stats_).num_model_nodes;
        *piVar1 = *piVar1 + 1;
      }
      uVar8 = (pAVar38->super_AlexNode<int,_int>).duplication_factor_;
      (local_f0->super_AlexNode<int,_int>).duplication_factor_ = uVar8;
      (pdVar22->super_AlexNode<int,_int>).duplication_factor_ = uVar8;
      uVar27 = local_50 - 1;
      local_a8 = local_50;
      pTVar24 = (local_a0->
                super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pAVar38 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 *)pTVar24[uVar27].node;
      pTVar30 = pTVar24 + uVar27;
      iVar36 = (int)(pAVar38->super_AlexNode<int,_int>).level_;
      pdVar37 = local_f0;
      local_e0 = pdVar22;
      local_50 = uVar27;
    } while (stop_propagation_level < iVar36);
  }
  if (iVar36 != stop_propagation_level) {
    __assert_fail("top_node->level_ == stop_propagation_level",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                  ,0x846,
                  "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                 );
  }
  if ((int)local_a8 ==
      (int)((ulong)((long)(local_a0->
                          super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar24) >> 4)) {
    *new_parent = (model_node_type *)pAVar38;
  }
  bVar18 = (local_f0->super_AlexNode<int,_int>).duplication_factor_;
  iVar36 = pTVar30->bucketID;
  iVar26 = 1 << (bVar18 & 0x1f);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Splitting upwards top node] level ",0x23);
    poVar21 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,stop_propagation_level);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", node addr: ",0xd);
    poVar21 = std::ostream::_M_insert<void_const*>(poVar21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", node children: ",0x11);
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,*(int *)&pAVar38->allocator_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", child index: ",0xf);
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", child repeats in node: ",0x19);
    poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,", node repeats in parent: ",0x1a);
    plVar25 = (long *)std::ostream::operator<<
                                (poVar21,1 << ((pAVar38->super_AlexNode<int,_int>).
                                               duplication_factor_ & 0x1f));
    std::ios::widen((char)*(undefined8 *)(*plVar25 + -0x18) + (char)plVar25);
    std::ostream::put((char)plVar25);
    std::ostream::flush();
  }
  if (bVar18 == 0) {
    piVar1 = &(local_c0->stats_).num_model_node_expansions;
    *piVar1 = *piVar1 + 1;
    plVar2 = &(local_c0->stats_).num_model_node_expansion_pointers;
    *plVar2 = *plVar2 + (long)*(int *)&pAVar38->allocator_;
    AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::expand
              ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)pAVar38,1);
    iVar33 = iVar36 * 2;
    iVar26 = iVar36 * 2 + 1;
    iVar36 = iVar36 * 2 + 2;
  }
  else {
    puVar3 = &(local_f0->super_AlexNode<int,_int>).duplication_factor_;
    *puVar3 = *puVar3 + 0xff;
    puVar3 = &(local_e0->super_AlexNode<int,_int>).duplication_factor_;
    *puVar3 = *puVar3 + 0xff;
    if (iVar26 < 2) goto LAB_0010d2b0;
    iVar33 = iVar36 - iVar36 % iVar26;
    iVar36 = iVar26 + iVar33;
    iVar26 = iVar26 / 2 + iVar33;
  }
  lVar28 = (long)iVar33;
  lVar34 = (long)iVar26;
  do {
    (&(pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar28] =
         (_func_int **)local_f0;
    lVar28 = lVar28 + 1;
  } while (lVar28 < lVar34);
  do {
    (&(pAVar38->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar34] =
         (_func_int **)local_e0;
    lVar34 = lVar34 + 1;
  } while (lVar34 < iVar36);
LAB_0010d2b0:
  ppAVar16 = to_delete.
             super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pAVar15 = local_c0;
  uVar55 = in_ZMM3._8_8_;
  for (ppAVar31 = to_delete.
                  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppAVar31 != ppAVar16;
      ppAVar31 = ppAVar31 + 1) {
    delete_node(pAVar15,*ppAVar31);
    uVar55 = in_ZMM3._8_8_;
  }
  if (to_delete.
      super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(to_delete.
                    super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)to_delete.
                          super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)to_delete.
                          super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  auVar43._0_8_ = (double)key;
  auVar43._8_8_ = uVar55;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar47;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar40;
  auVar6 = vfmadd132sd_fma(auVar43,auVar46,auVar7);
  if (auVar6._0_8_ < dVar11) {
    pdVar20 = pdVar19;
  }
  return pdVar20;
}

Assistant:

data_node_type* split_upwards(
      T key, int stop_propagation_level,
      const std::vector<TraversalNode>& traversal_path, bool reuse_model,
      model_node_type** new_parent, bool verbose = false) {
    assert(stop_propagation_level >= root_node_->level_);
    std::vector<AlexNode<T, P>*> to_delete;  // nodes that need to be deleted

    // Split the data node into two new data nodes
    const TraversalNode& parent_path_node = traversal_path.back();
    model_node_type* parent = parent_path_node.node;
    auto leaf = static_cast<data_node_type*>(
        parent->children_[parent_path_node.bucketID]);
    int leaf_repeats = 1 << (leaf->duplication_factor_);
    int leaf_start_bucketID =
        parent_path_node.bucketID - (parent_path_node.bucketID % leaf_repeats);
    double leaf_mid_bucketID = leaf_start_bucketID + leaf_repeats / 2.0;
    int leaf_end_bucketID =
        leaf_start_bucketID + leaf_repeats;  // first bucket with next child
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    // Determine if either of the two new data nodes will need to adapt to
    // append-mostly behavior
    bool append_mostly_right = leaf->is_append_mostly_right();
    bool left_half_appending_right = false, right_half_appending_right = false;
    if (append_mostly_right) {
      double appending_right_bucketID =
          parent->model_.predict_double(leaf->max_key_);
      if (appending_right_bucketID >= leaf_start_bucketID &&
          appending_right_bucketID < leaf_mid_bucketID) {
        left_half_appending_right = true;
      } else if (appending_right_bucketID >= leaf_mid_bucketID &&
                 appending_right_bucketID < leaf_end_bucketID) {
        right_half_appending_right = true;
      }
    }
    bool append_mostly_left = leaf->is_append_mostly_left();
    bool left_half_appending_left = false, right_half_appending_left = false;
    if (append_mostly_left) {
      double appending_left_bucketID =
          parent->model_.predict_double(leaf->min_key_);
      if (appending_left_bucketID >= leaf_start_bucketID &&
          appending_left_bucketID < leaf_mid_bucketID) {
        left_half_appending_left = true;
      } else if (appending_left_bucketID >= leaf_mid_bucketID &&
                 appending_left_bucketID < leaf_end_bucketID) {
        right_half_appending_left = true;
      }
    }

    int mid_boundary = leaf->lower_bound(
        (leaf_mid_bucketID - parent->model_.b_) / parent->model_.a_);
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        leaf, 0, mid_boundary, true, nullptr, reuse_model,
        append_mostly_right && left_half_appending_right,
        append_mostly_left && left_half_appending_left);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        leaf, mid_boundary, leaf->data_capacity_, true, nullptr, reuse_model,
        append_mostly_right && right_half_appending_right,
        append_mostly_left && right_half_appending_left);
    // This is the expected duplication factor; it will be correct once we
    // split/expand the parent
    left_leaf->duplication_factor_ = leaf->duplication_factor_;
    right_leaf->duplication_factor_ = leaf->duplication_factor_;
    left_leaf->level_ = leaf->level_;
    right_leaf->level_ = leaf->level_;
    link_data_nodes(leaf, left_leaf, right_leaf);
    to_delete.push_back(leaf);
    stats_.num_data_nodes--;

    if (verbose) {
      std::cout << "[Splitting upwards data node] level " << leaf->level_
                << ", node addr: " << leaf
                << ", node repeats in parent: " << leaf_repeats
                << ", node indexes in parent: [" << leaf_start_bucketID << ", "
                << leaf_end_bucketID << ")"
                << ", left leaf indexes: [0, " << mid_boundary << ")"
                << ", right leaf indexes: [" << mid_boundary << ", "
                << leaf->data_capacity_ << ")"
                << ", new nodes addr: " << left_leaf << "," << right_leaf
                << std::endl;
    }

    // The new data node that the key falls into is the one we return
    data_node_type* new_data_node;
    if (parent->model_.predict_double(key) < leaf_mid_bucketID) {
      new_data_node = left_leaf;
    } else {
      new_data_node = right_leaf;
    }

    // Split all internal nodes from the parent up to the highest node along the
    // traversal path.
    // As this happens, the entries of the traversal path will go stale, which
    // is fine because we no longer use them.
    // Splitting an internal node involves dividing the child pointers into two
    // halves, and doubling the relevant half.
    AlexNode<T, P>* prev_left_split = left_leaf;
    AlexNode<T, P>* prev_right_split = right_leaf;
    int path_idx = static_cast<int>(traversal_path.size()) - 1;
    while (traversal_path[path_idx].node->level_ > stop_propagation_level) {
      // Decide which half to double
      const TraversalNode& path_node = traversal_path[path_idx];
      model_node_type* cur_node = path_node.node;
      stats_.num_model_node_splits++;
      stats_.num_model_node_split_pointers += cur_node->num_children_;
      bool double_left_half = path_node.bucketID < cur_node->num_children_ / 2;
      model_node_type* left_split = nullptr;
      model_node_type* right_split = nullptr;

      // If one of the resulting halves will only have one child pointer, we
      // should "pull up" that child
      bool pull_up_left_child = false, pull_up_right_child = false;
      AlexNode<T, P>* left_half_first_child = cur_node->children_[0];
      AlexNode<T, P>* right_half_first_child =
          cur_node->children_[cur_node->num_children_ / 2];
      if (double_left_half &&
          (1 << right_half_first_child->duplication_factor_) ==
              cur_node->num_children_ / 2) {
        // pull up right child if all children in the right half are the same
        pull_up_right_child = true;
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else if (!double_left_half &&
                 (1 << left_half_first_child->duplication_factor_) ==
                     cur_node->num_children_ / 2) {
        // pull up left child if all children in the left half are the same
        pull_up_left_child = true;
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else {
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      }

      // Do the split
      AlexNode<T, P>* next_left_split = nullptr;
      AlexNode<T, P>* next_right_split = nullptr;
      if (double_left_half) {
        // double left half
        assert(left_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = left_split;
        }
        left_split->num_children_ = cur_node->num_children_;
        left_split->children_ =
            new (pointer_allocator().allocate(left_split->num_children_))
                AlexNode<T, P>*[left_split->num_children_];
        left_split->model_.a_ = cur_node->model_.a_ * 2;
        left_split->model_.b_ = cur_node->model_.b_ * 2;
        int cur = 0;
        while (cur < cur_node->num_children_ / 2) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          for (int i = 2 * cur; i < 2 * (cur + cur_child_repeats); i++) {
            left_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_ / 2);

        if (pull_up_right_child) {
          next_right_split = cur_node->children_[cur_node->num_children_ / 2];
          next_right_split->level_ = cur_node->level_;
        } else {
          right_split->num_children_ = cur_node->num_children_ / 2;
          right_split->children_ =
              new (pointer_allocator().allocate(right_split->num_children_))
                  AlexNode<T, P>*[right_split->num_children_];
          right_split->model_.a_ = cur_node->model_.a_;
          right_split->model_.b_ =
              cur_node->model_.b_ - cur_node->num_children_ / 2;
          int j = 0;
          for (int i = cur_node->num_children_ / 2; i < cur_node->num_children_;
               i++) {
            right_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_right_split = right_split;
        }

        int new_bucketID = path_node.bucketID * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          left_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          left_split->children_[i] = prev_right_split;
        }
        next_left_split = left_split;
      } else {
        // double right half
        assert(right_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = right_split;
        }
        if (pull_up_left_child) {
          next_left_split = cur_node->children_[0];
          next_left_split->level_ = cur_node->level_;
        } else {
          left_split->num_children_ = cur_node->num_children_ / 2;
          left_split->children_ =
              new (pointer_allocator().allocate(left_split->num_children_))
                  AlexNode<T, P>*[left_split->num_children_];
          left_split->model_.a_ = cur_node->model_.a_;
          left_split->model_.b_ = cur_node->model_.b_;
          int j = 0;
          for (int i = 0; i < cur_node->num_children_ / 2; i++) {
            left_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_left_split = left_split;
        }

        right_split->num_children_ = cur_node->num_children_;
        right_split->children_ =
            new (pointer_allocator().allocate(right_split->num_children_))
                AlexNode<T, P>*[right_split->num_children_];
        right_split->model_.a_ = cur_node->model_.a_ * 2;
        right_split->model_.b_ =
            (cur_node->model_.b_ - cur_node->num_children_ / 2) * 2;
        int cur = cur_node->num_children_ / 2;
        while (cur < cur_node->num_children_) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          int right_child_idx = cur - cur_node->num_children_ / 2;
          for (int i = 2 * right_child_idx;
               i < 2 * (right_child_idx + cur_child_repeats); i++) {
            right_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_);

        int new_bucketID =
            (path_node.bucketID - cur_node->num_children_ / 2) * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          right_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          right_split->children_[i] = prev_right_split;
        }
        next_right_split = right_split;
      }
      assert(next_left_split != nullptr && next_right_split != nullptr);
      if (verbose) {
        std::cout << "[Splitting upwards through-node] level "
                  << cur_node->level_ << ", node addr: " << path_node.node
                  << ", node children: " << path_node.node->num_children_
                  << ", child index: " << path_node.bucketID
                  << ", child repeats in node: "
                  << (1 << prev_left_split->duplication_factor_)
                  << ", node repeats in parent: "
                  << (1 << path_node.node->duplication_factor_)
                  << ", new nodes addr: " << left_split << "," << right_split
                  << std::endl;
      }
      to_delete.push_back(cur_node);
      if (!pull_up_left_child && !pull_up_right_child) {
        stats_.num_model_nodes++;
      }
      // This is the expected duplication factor; it will be correct once we
      // split/expand the parent
      next_left_split->duplication_factor_ = cur_node->duplication_factor_;
      next_right_split->duplication_factor_ = cur_node->duplication_factor_;
      prev_left_split = next_left_split;
      prev_right_split = next_right_split;
      path_idx--;
    }

    // Insert into the top node
    const TraversalNode& top_path_node = traversal_path[path_idx];
    model_node_type* top_node = top_path_node.node;
    assert(top_node->level_ == stop_propagation_level);
    if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
      *new_parent = top_node;
    }
    int top_bucketID = top_path_node.bucketID;
    int repeats =
        1 << prev_left_split->duplication_factor_;  // this was the duplication
                                                    // factor of the child that
                                                    // was deleted
    if (verbose) {
      std::cout << "[Splitting upwards top node] level "
                << stop_propagation_level << ", node addr: " << top_node
                << ", node children: " << top_node->num_children_
                << ", child index: " << top_bucketID
                << ", child repeats in node: " << repeats
                << ", node repeats in parent: "
                << (1 << top_node->duplication_factor_) << std::endl;
    }

    // Expand the top node if necessary
    if (repeats == 1) {
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += top_node->num_children_;
      top_node->expand(1);  // double size of top node
      top_bucketID *= 2;
      repeats *= 2;
    } else {
      prev_left_split->duplication_factor_--;
      prev_right_split->duplication_factor_--;
    }

    int start_bucketID =
        top_bucketID -
        (top_bucketID % repeats);  // first bucket with same child
    int mid_bucketID = start_bucketID + repeats / 2;
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with next child
    for (int i = start_bucketID; i < mid_bucketID; i++) {
      top_node->children_[i] = prev_left_split;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      top_node->children_[i] = prev_right_split;
    }

    for (auto node : to_delete) {
      delete_node(node);
    }

    return new_data_node;
  }